

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  int *piVar4;
  size_type *psVar5;
  pointer pp_Var6;
  FlagSettingMode set_mode;
  string usage_message;
  char *test_argv [4];
  int local_a4;
  char **local_a0;
  string local_98;
  string local_78;
  string local_58;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  
  local_28 = "3rd argv";
  pcStack_20 = "argv #4";
  local_38 = "/test/argv/for/gflags_unittest";
  pcStack_30 = "argv 2";
  local_a4 = argc;
  local_a0 = argv;
  gflags::SetArgv(4,&local_38);
  pcVar2 = gflags::GetArgv0();
  std::__cxx11::string::string((string *)&local_78,pcVar2,(allocator *)&local_58);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_98._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_98._M_dataplus._M_p == psVar5) {
    local_98.field_2._M_allocated_capacity = *psVar5;
    local_98.field_2._8_8_ = plVar3[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar5;
  }
  local_98._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  set_mode = 0xf;
  std::__cxx11::string::_M_replace
            (fLS::FLAGS_tryfromenv_abi_cxx11_,0,*(char **)(fLS::FLAGS_tryfromenv_abi_cxx11_ + 8),
             0x150be5);
  setenv("FLAGS_test_tryfromenv","pre-set",1);
  gflags::SetCommandLineOptionWithMode_abi_cxx11_
            (&local_78,(gflags *)"changed_bool1","true",(char *)0x2,set_mode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  fLB::FLAGS_changed_bool2 = 1;
  gflags::SetUsageMessage(&local_98);
  local_58.field_2._M_allocated_capacity = 0x7265765f74736574;
  local_58.field_2._8_4_ = 0x6e6f6973;
  local_58._M_string_length = 0xc;
  local_58.field_2._M_local_buf[0xc] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  gflags::SetVersionString(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  gflags::ParseCommandLineFlags(&local_a4,&local_a0,true);
  if (fLS::FLAGS_test_tmpdir_abi_cxx11_[1] != 0) {
    iVar1 = mkdir((char *)*fLS::FLAGS_test_tmpdir_abi_cxx11_,0x1ed);
    if (iVar1 == 0) goto LAB_0013554a;
    piVar4 = __errno_location();
    if (*piVar4 == 0x11) goto LAB_0013554a;
  }
  mkdir("/tmp/gflags_unittest",0x1ed);
LAB_0013554a:
  if (argc == 1) {
    fwrite("Running the unit tests now...\n\n",0x1f,1,_stdout);
    fflush(_stdout);
    for (pp_Var6 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pp_Var6 !=
        g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
        super__Vector_impl_data._M_finish; pp_Var6 = pp_Var6 + 1) {
      (**pp_Var6)();
    }
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  gflags::ShutDownCommandLineFlags();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  return GFLAGS_NAMESPACE::main(argc, argv);
}